

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

double __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<double,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int *piVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  unsigned_fast_type uVar10;
  int iVar11;
  value_type_conflict *x;
  limb_type lm_mask;
  int iVar12;
  bool bVar13;
  local_unsigned_wide_integer_type u;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar2 = *(int *)(this + 0x1c);
  local_48 = *(undefined8 *)(this + 0x10);
  uStack_40 = *(undefined8 *)(this + 0x18);
  local_58 = *(undefined8 *)this;
  uStack_50 = *(undefined8 *)(this + 8);
  if (iVar2 < 0) {
    lVar9 = 0;
    do {
      *(uint *)((long)&local_58 + lVar9) = ~*(uint *)((long)&local_58 + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x20);
    lVar9 = 0;
    do {
      piVar1 = (int *)((long)&local_58 + lVar9);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar13 = lVar9 != 0x1c;
      lVar9 = lVar9 + 4;
    } while (bVar13);
  }
  x = (value_type_conflict *)&local_38;
  local_28 = local_48;
  uStack_20 = uStack_40;
  local_38 = local_58;
  uStack_30 = uStack_50;
  uVar10 = msb<256u,unsigned_int,void,false>((uintwide_t<256U,_unsigned_int,_void,_false> *)x);
  uVar7 = (int)uVar10 + 1;
  iVar11 = (uint)((uVar7 & 0x1f) != 0) + (uVar7 >> 5);
  if (iVar11 == 0) {
    dVar3 = 0.0;
  }
  else {
    iVar8 = 0;
    dVar6 = 1.0;
    dVar3 = 0.0;
    do {
      uVar7 = 1;
      iVar12 = 0x20;
      dVar5 = 0.0;
      do {
        dVar4 = dVar5 + dVar6;
        if ((*x & uVar7) == 0) {
          dVar4 = dVar5;
        }
        uVar7 = uVar7 * 2;
        dVar6 = dVar6 + dVar6;
        iVar12 = iVar12 + -1;
        dVar5 = dVar4;
      } while (iVar12 != 0);
      dVar3 = dVar3 + dVar4;
      x = x + 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar11);
  }
  if (iVar2 < 0) {
    dVar3 = -dVar3;
  }
  return dVar3;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }